

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t42parse.c
# Opt level: O2

void t42_parse_sfnts(T42_Face face,T42_Loader loader)

{
  byte bVar1;
  FT_Memory pFVar2;
  byte *pbVar3;
  ulong uVar4;
  FT_Offset new_count;
  FT_Byte *pFVar5;
  FT_Byte *pFVar6;
  FT_ULong *pFVar7;
  long lVar8;
  long lVar9;
  FT_ULong FVar10;
  ulong uVar11;
  uint uVar12;
  FT_Byte *pFVar13;
  int iVar14;
  ulong uVar15;
  ulong local_70;
  FT_ULong real_size;
  ulong local_60;
  FT_Offset local_58;
  FT_Memory local_50;
  uint local_44;
  FT_Byte *local_40;
  uint local_38;
  FT_Error local_34 [2];
  FT_Error error;
  
  pFVar6 = (loader->parser).root.limit;
  pFVar2 = (loader->parser).root.memory;
  (*(loader->parser).root.funcs.skip_spaces)((PS_Parser)loader);
  pFVar5 = (loader->parser).root.cursor;
  local_50 = pFVar2;
  if ((pFVar5 < pFVar6) && ((loader->parser).root.cursor = pFVar5 + 1, *pFVar5 == '[')) {
    (*(loader->parser).root.funcs.skip_spaces)((PS_Parser)loader);
    local_58 = 0;
    uVar11 = 0;
    iVar14 = 0;
    pFVar13 = (FT_Byte *)0x0;
    local_44 = 0;
    uVar4 = 0;
    pFVar5 = (FT_Byte *)0x0;
    real_size = (FT_ULong)pFVar6;
    while (FVar10 = real_size, pbVar3 = (loader->parser).root.cursor, pbVar3 < real_size) {
      bVar1 = *pbVar3;
      if (bVar1 == 0x3c) {
        local_38 = (uint)uVar11;
        local_40 = pFVar13;
        (*(loader->parser).root.funcs.skip_PS_token)((PS_Parser)loader);
        if ((loader->parser).root.error != 0) {
          uVar11 = (ulong)local_38;
          goto LAB_00230649;
        }
        pFVar6 = (loader->parser).root.cursor;
        new_count = (long)(pFVar6 + ~(ulong)pbVar3) / 2;
        if ((ulong)((long)pFVar6 - (long)pbVar3) < 3) {
LAB_00230638:
          local_34[0] = 3;
        }
        else {
          pFVar5 = (FT_Byte *)ft_mem_realloc(local_50,1,local_58,new_count,pFVar5,local_34);
          if (local_34[0] == 0) {
            (loader->parser).root.cursor = pbVar3;
            pFVar7 = &local_70;
            (*(loader->parser).root.funcs.to_bytes)
                      ((PS_Parser)loader,pFVar5,new_count,pFVar7,'\x01');
            uVar11 = CONCAT71((int7)((ulong)pFVar7 >> 8),1);
            uVar4 = local_70;
            pFVar13 = local_40;
            goto LAB_00230470;
          }
        }
LAB_00230642:
        uVar11 = (ulong)local_38;
        goto LAB_00230645;
      }
      if (bVar1 == 0x5d) {
        (loader->parser).root.cursor = pbVar3 + 1;
        goto LAB_00230649;
      }
      new_count = local_58;
      if (bVar1 - 0x30 < 10) {
        if ((char)uVar11 != '\0') break;
        local_40 = pFVar13;
        uVar4 = (*(loader->parser).root.funcs.to_int)((PS_Parser)loader);
        if ((long)uVar4 < 0) {
          local_34[0] = 3;
          uVar11 = 0;
          goto LAB_00230645;
        }
        (*(loader->parser).root.funcs.skip_PS_token)((PS_Parser)loader);
        if ((loader->parser).root.error != 0) {
          return;
        }
        pFVar6 = (loader->parser).root.cursor;
        pFVar5 = pFVar6 + 1;
        if (FVar10 - (long)pFVar6 <= uVar4) goto LAB_00230634;
        (loader->parser).root.cursor = pFVar6 + uVar4 + 1;
        uVar11 = 0;
        pFVar13 = local_40;
        new_count = local_58;
      }
      else {
LAB_00230470:
        FVar10 = real_size;
        if (pFVar5 == (FT_Byte *)0x0) {
          local_34[0] = 3;
          pFVar5 = (FT_Byte *)0x0;
          goto LAB_00230645;
        }
      }
      local_58 = new_count;
      if ((uVar4 & 1) == 0) {
LAB_0023048d:
        if (uVar4 == 0) break;
      }
      else if (pFVar5[uVar4 - 1] == '\0') {
        uVar4 = uVar4 - 1;
        goto LAB_0023048d;
      }
      local_38 = (uint)uVar11;
      uVar11 = FVar10 - (long)(loader->parser).root.cursor;
      local_60 = uVar4;
      local_40 = pFVar5;
      for (uVar15 = 0; uVar15 != uVar4; uVar15 = uVar15 + 1) {
        if (iVar14 == 2) {
LAB_002305dd:
          iVar14 = 2;
          if (face->ttf_size <= (long)pFVar13) goto LAB_00230638;
        }
        else if (iVar14 == 1) {
LAB_00230532:
          lVar8 = face->ttf_size;
          if (lVar8 <= (long)pFVar13) {
            uVar4 = 0;
            if (0 < (int)local_44) {
              uVar4 = (ulong)local_44;
            }
            for (lVar9 = 0; uVar4 * 0x10 != lVar9; lVar9 = lVar9 + 0x10) {
              uVar12 = *(uint *)(face->ttf_data + lVar9 + 0x18);
              uVar12 = uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 |
                       uVar12 << 0x18;
              if ((uVar11 < uVar12) || ((long)(uVar11 - uVar12) < lVar8)) goto LAB_00230638;
              lVar8 = lVar8 + (ulong)(uVar12 + 3 & 0xfffffffc);
              face->ttf_size = lVar8;
            }
            pFVar6 = (FT_Byte *)
                     ft_mem_realloc(local_50,1,(ulong)(local_44 << 4 | 0xc),lVar8 + 1,face->ttf_data
                                    ,local_34);
            face->ttf_data = pFVar6;
            uVar4 = local_60;
            pFVar5 = local_40;
            if (local_34[0] == 0) goto LAB_002305dd;
            goto LAB_00230642;
          }
          iVar14 = 1;
        }
        else {
          iVar14 = 0;
          if (0xb < (long)pFVar13) {
            pFVar6 = face->ttf_data;
            local_44 = (uint)pFVar6[5] + (uint)pFVar6[4] * 0x10;
            uVar4 = (ulong)(local_44 * 0x10 | 0xc);
            face->ttf_size = uVar4;
            if ((long)uVar4 <= (long)uVar11) {
              pFVar6 = (FT_Byte *)ft_mem_realloc(local_50,1,0xc,uVar4,pFVar6,local_34);
              face->ttf_data = pFVar6;
              uVar4 = local_60;
              pFVar5 = local_40;
              if (local_34[0] == 0) goto LAB_00230532;
              goto LAB_00230642;
            }
            goto LAB_00230638;
          }
        }
        face->ttf_data[(long)pFVar13] = pFVar5[uVar15];
        pFVar13 = pFVar13 + 1;
      }
      (*(loader->parser).root.funcs.skip_spaces)((PS_Parser)loader);
      uVar11 = (ulong)local_38;
      uVar4 = local_60;
      pFVar5 = local_40;
    }
    local_34[0] = 3;
  }
  else {
    pFVar5 = (FT_Byte *)0x0;
LAB_00230634:
    local_34[0] = 3;
    uVar11 = 0;
  }
LAB_00230645:
  (loader->parser).root.error = local_34[0];
LAB_00230649:
  if ((char)uVar11 != '\0') {
    ft_mem_free(local_50,pFVar5);
  }
  return;
}

Assistant:

static void
  t42_parse_sfnts( T42_Face    face,
                   T42_Loader  loader )
  {
    T42_Parser  parser = &loader->parser;
    FT_Memory   memory = parser->root.memory;
    FT_Byte*    cur;
    FT_Byte*    limit  = parser->root.limit;
    FT_Error    error;
    FT_Int      num_tables = 0;
    FT_Long     count;

    FT_ULong    n, string_size, old_string_size, real_size;
    FT_Byte*    string_buf = NULL;
    FT_Bool     allocated  = 0;

    T42_Load_Status  status;


    /* The format is                                */
    /*                                              */
    /*   /sfnts [ <hexstring> <hexstring> ... ] def */
    /*                                              */
    /* or                                           */
    /*                                              */
    /*   /sfnts [                                   */
    /*      <num_bin_bytes> RD <binary data>        */
    /*      <num_bin_bytes> RD <binary data>        */
    /*      ...                                     */
    /*   ] def                                      */
    /*                                              */
    /* with exactly one space after the `RD' token. */

    T1_Skip_Spaces( parser );

    if ( parser->root.cursor >= limit || *parser->root.cursor++ != '[' )
    {
      FT_ERROR(( "t42_parse_sfnts: can't find begin of sfnts vector\n" ));
      error = FT_THROW( Invalid_File_Format );
      goto Fail;
    }

    T1_Skip_Spaces( parser );
    status          = BEFORE_START;
    string_size     = 0;
    old_string_size = 0;
    count           = 0;

    while ( parser->root.cursor < limit )
    {
      FT_ULong  size;


      cur = parser->root.cursor;

      if ( *cur == ']' )
      {
        parser->root.cursor++;
        goto Exit;
      }

      else if ( *cur == '<' )
      {
        T1_Skip_PS_Token( parser );
        if ( parser->root.error )
          goto Exit;

        /* don't include delimiters */
        string_size = (FT_ULong)( ( parser->root.cursor - cur - 2 + 1 ) / 2 );
        if ( !string_size )
        {
          FT_ERROR(( "t42_parse_sfnts: invalid data in sfnts array\n" ));
          error = FT_THROW( Invalid_File_Format );
          goto Fail;
        }
        if ( FT_REALLOC( string_buf, old_string_size, string_size ) )
          goto Fail;

        allocated = 1;

        parser->root.cursor = cur;
        (void)T1_ToBytes( parser, string_buf, string_size, &real_size, 1 );
        old_string_size = string_size;
        string_size     = real_size;
      }

      else if ( ft_isdigit( *cur ) )
      {
        FT_Long  tmp;


        if ( allocated )
        {
          FT_ERROR(( "t42_parse_sfnts: "
                     "can't handle mixed binary and hex strings\n" ));
          error = FT_THROW( Invalid_File_Format );
          goto Fail;
        }

        tmp = T1_ToInt( parser );
        if ( tmp < 0 )
        {
          FT_ERROR(( "t42_parse_sfnts: invalid string size\n" ));
          error = FT_THROW( Invalid_File_Format );
          goto Fail;
        }
        else
          string_size = (FT_ULong)tmp;

        T1_Skip_PS_Token( parser );             /* `RD' */
        if ( parser->root.error )
          return;

        string_buf = parser->root.cursor + 1;   /* one space after `RD' */

        if ( (FT_ULong)( limit - parser->root.cursor ) <= string_size )
        {
          FT_ERROR(( "t42_parse_sfnts: too much binary data\n" ));
          error = FT_THROW( Invalid_File_Format );
          goto Fail;
        }
        else
          parser->root.cursor += string_size + 1;
      }

      if ( !string_buf )
      {
        FT_ERROR(( "t42_parse_sfnts: invalid data in sfnts array\n" ));
        error = FT_THROW( Invalid_File_Format );
        goto Fail;
      }

      /* A string can have a trailing zero (odd) byte for padding. */
      /* Ignore it.                                                */
      if ( ( string_size & 1 ) && string_buf[string_size - 1] == 0 )
        string_size--;

      if ( !string_size )
      {
        FT_ERROR(( "t42_parse_sfnts: invalid string\n" ));
        error = FT_THROW( Invalid_File_Format );
        goto Fail;
      }

      /* The whole TTF is now loaded into `string_buf'.  We are */
      /* checking its contents while copying it to `ttf_data'.  */

      size = (FT_ULong)( limit - parser->root.cursor );

      for ( n = 0; n < string_size; n++ )
      {
        switch ( status )
        {
        case BEFORE_START:
          /* load offset table, 12 bytes */
          if ( count < 12 )
          {
            face->ttf_data[count++] = string_buf[n];
            continue;
          }
          else
          {
            num_tables     = 16 * face->ttf_data[4] + face->ttf_data[5];
            status         = BEFORE_TABLE_DIR;
            face->ttf_size = 12 + 16 * num_tables;

            if ( (FT_Long)size < face->ttf_size )
            {
              FT_ERROR(( "t42_parse_sfnts: invalid data in sfnts array\n" ));
              error = FT_THROW( Invalid_File_Format );
              goto Fail;
            }

            if ( FT_REALLOC( face->ttf_data, 12, face->ttf_size ) )
              goto Fail;
          }
          /* fall through */

        case BEFORE_TABLE_DIR:
          /* the offset table is read; read the table directory */
          if ( count < face->ttf_size )
          {
            face->ttf_data[count++] = string_buf[n];
            continue;
          }
          else
          {
            int       i;
            FT_ULong  len;


            for ( i = 0; i < num_tables; i++ )
            {
              FT_Byte*  p = face->ttf_data + 12 + 16 * i + 12;


              len = FT_PEEK_ULONG( p );
              if ( len > size                               ||
                   face->ttf_size > (FT_Long)( size - len ) )
              {
                FT_ERROR(( "t42_parse_sfnts:"
                           " invalid data in sfnts array\n" ));
                error = FT_THROW( Invalid_File_Format );
                goto Fail;
              }

              /* Pad to a 4-byte boundary length */
              face->ttf_size += (FT_Long)( ( len + 3 ) & ~3U );
            }

            status = OTHER_TABLES;

            if ( FT_REALLOC( face->ttf_data, 12 + 16 * num_tables,
                             face->ttf_size + 1 ) )
              goto Fail;
          }
          /* fall through */

        case OTHER_TABLES:
          /* all other tables are just copied */
          if ( count >= face->ttf_size )
          {
            FT_ERROR(( "t42_parse_sfnts: too much binary data\n" ));
            error = FT_THROW( Invalid_File_Format );
            goto Fail;
          }
          face->ttf_data[count++] = string_buf[n];
        }
      }

      T1_Skip_Spaces( parser );
    }

    /* if control reaches this point, the format was not valid */
    error = FT_THROW( Invalid_File_Format );

  Fail:
    parser->root.error = error;

  Exit:
    if ( allocated )
      FT_FREE( string_buf );
  }